

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_protocol.cpp
# Opt level: O1

void RunNetSpecs(int player,int buf)

{
  byte bVar1;
  byte *pbVar2;
  BYTE *stream;
  int len;
  byte *local_30;
  int local_24;
  
  if (gametic % ticdup == 0) {
    local_30 = FDynamicBuffer::GetData(NetSpecs[player] + buf,&local_24);
    if (local_30 != (byte *)0x0) {
      pbVar2 = local_30 + local_24;
      if (local_30 < pbVar2) {
        do {
          bVar1 = *local_30;
          local_30 = local_30 + 1;
          Net_DoCommand((uint)bVar1,&local_30,player);
        } while (local_30 < pbVar2);
      }
      if (demorecording == false) {
        FDynamicBuffer::SetData(NetSpecs[player] + buf,(BYTE *)0x0,0);
      }
    }
  }
  return;
}

Assistant:

void RunNetSpecs (int player, int buf)
{
	BYTE *stream;
	int len;

	if (gametic % ticdup == 0)
	{
		stream = NetSpecs[player][buf].GetData (&len);
		if (stream)
		{
			BYTE *end = stream + len;
			while (stream < end)
			{
				int type = ReadByte (&stream);
				Net_DoCommand (type, &stream, player);
			}
			if (!demorecording)
				NetSpecs[player][buf].SetData (NULL, 0);
		}
	}
}